

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_probe_side_optimizer.cpp
# Opt level: O2

void duckdb::GetRowidBindings(LogicalOperator *op,vector<duckdb::ColumnBinding,_true> *bindings)

{
  pointer puVar1;
  idx_t *piVar2;
  LogicalGet *this;
  vector<duckdb::ColumnIndex,_true> *pvVar3;
  type op_00;
  ColumnIndex *col_id;
  pointer pCVar4;
  vector<duckdb::ColumnBinding,_true> *__range3;
  ColumnBinding *binding;
  value_type *__x;
  pointer this_00;
  vector<duckdb::ColumnBinding,_true> get_bindings;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_38;
  
  if (op->type == LOGICAL_GET) {
    this = LogicalOperator::Cast<duckdb::LogicalGet>(op);
    (*(this->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_38,this);
    pvVar3 = LogicalGet::GetColumnIds(this);
    pCVar4 = (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (pCVar4 == (pvVar3->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                    ).super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                    _M_impl.super__Vector_impl_data._M_finish) goto LAB_015b8cbf;
      piVar2 = &pCVar4->index;
      pCVar4 = pCVar4 + 1;
      __x = local_38._M_impl.super__Vector_impl_data._M_start;
    } while (*piVar2 != 0xffffffffffffffff);
    for (; __x != local_38._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::push_back
                (&bindings->
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,__x);
    }
LAB_015b8cbf:
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base(&local_38);
  }
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    GetRowidBindings(op_00,bindings);
  }
  return;
}

Assistant:

static void GetRowidBindings(LogicalOperator &op, vector<ColumnBinding> &bindings) {
	if (op.type == LogicalOperatorType::LOGICAL_GET) {
		auto &get = op.Cast<LogicalGet>();
		auto get_bindings = get.GetColumnBindings();
		auto &column_ids = get.GetColumnIds();
		bool has_row_id = false;
		for (auto &col_id : column_ids) {
			if (col_id.IsRowIdColumn()) {
				has_row_id = true;
				break;
			}
		}
		if (has_row_id) {
			for (auto &binding : get_bindings) {
				bindings.push_back(binding);
			}
		}
	}
	for (auto &child : op.children) {
		GetRowidBindings(*child, bindings);
	}
}